

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseSizeof(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynBase *this;
  undefined4 extraout_var;
  SynBase *this_00;
  undefined4 extraout_var_00;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_sizeof) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_15b62::CheckConsume(ctx,lex_oparen,"ERROR: sizeof must be followed by \'(\'")
    ;
    this = ParseAssignment(ctx);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_15b62::Report
                (ctx,ctx->currentLexeme,"ERROR: expression or type not found after sizeof(");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var,iVar1);
      SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
    }
    anon_unknown.dwarf_15b62::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after expression in sizeof");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar1);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase(this_00,0x1f,begin,ctx->currentLexeme + -1);
    this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222638;
    this_00[1]._vptr_SynBase = (_func_int **)this;
  }
  else {
    this_00 = (SynBase *)0x0;
  }
  return this_00;
}

Assistant:

SynBase* ParseSizeof(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_sizeof))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: sizeof must be followed by '('");

		SynBase *value = ParseAssignment(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression or type not found after sizeof(");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after expression in sizeof");

		return new (ctx.get<SynSizeof>()) SynSizeof(start, ctx.Previous(), value);
	}

	return NULL;
}